

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder_test.cpp
# Opt level: O2

void __thiscall forwarder::forwarder(forwarder *this,bool internal)

{
  string *psVar1;
  copyable *pcVar2;
  ulong uVar3;
  service *this_00;
  ostream *poVar4;
  char *pcVar5;
  runtime_error *this_01;
  application *rhs;
  undefined8 uVar6;
  allocator local_20a;
  allocator local_209;
  value local_208;
  int local_1fc;
  value settings;
  allocator local_1e9;
  string local_1e8 [32];
  value local_1c8 [4];
  intrusive_ptr<cppcms::application> local_1a8;
  ostringstream oss;
  int local_180;
  
  (this->srv).super___shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->srv).super___shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->app_).p_ = (application *)0x0;
  cppcms::json::value::copyable::copyable(&settings.d);
  cppcms::json::value::value<char[5]>(local_1c8,(char (*) [5])"http");
  std::__cxx11::string::string((string *)&oss,"service",(allocator *)&local_208);
  psVar1 = (string *)cppcms::json::value::operator[]((string *)&settings);
  std::__cxx11::string::string(local_1e8,"api",(allocator *)&local_1fc);
  pcVar2 = (copyable *)cppcms::json::value::operator[](psVar1);
  cppcms::json::value::copyable::operator=(pcVar2,&local_1c8[0].d);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string((string *)&oss);
  cppcms::json::value::copyable::~copyable(&local_1c8[0].d);
  local_208.d = (copyable)0x90;
  local_208._1_3_ = 0x1f;
  cppcms::json::value::value<int>(local_1c8,(int *)&local_208);
  std::__cxx11::string::string((string *)&oss,"service",(allocator *)&local_1fc);
  psVar1 = (string *)cppcms::json::value::operator[]((string *)&settings);
  std::__cxx11::string::string(local_1e8,"port",&local_20a);
  pcVar2 = (copyable *)cppcms::json::value::operator[](psVar1);
  cppcms::json::value::copyable::operator=(pcVar2,&local_1c8[0].d);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string((string *)&oss);
  cppcms::json::value::copyable::~copyable(&local_1c8[0].d);
  local_208.d = (copyable)0x1;
  cppcms::json::value::value<bool>(local_1c8,(bool *)&local_208);
  std::__cxx11::string::string((string *)&oss,"service",(allocator *)&local_1fc);
  psVar1 = (string *)cppcms::json::value::operator[]((string *)&settings);
  std::__cxx11::string::string(local_1e8,"disable_global_exit_handling",&local_20a);
  pcVar2 = (copyable *)cppcms::json::value::operator[](psVar1);
  cppcms::json::value::copyable::operator=(pcVar2,&local_1c8[0].d);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string((string *)&oss);
  cppcms::json::value::copyable::~copyable(&local_1c8[0].d);
  cppcms::json::value::value<char[6]>(local_1c8,(char (*) [6])"/test");
  std::__cxx11::string::string((string *)&oss,"http",(allocator *)&local_208);
  psVar1 = (string *)cppcms::json::value::operator[]((string *)&settings);
  std::__cxx11::string::string(local_1e8,"script_names",(allocator *)&local_1fc);
  uVar3 = cppcms::json::value::operator[](psVar1);
  pcVar2 = (copyable *)cppcms::json::value::operator[](uVar3);
  cppcms::json::value::copyable::operator=(pcVar2,&local_1c8[0].d);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string((string *)&oss);
  cppcms::json::value::copyable::~copyable(&local_1c8[0].d);
  if (internal) {
    cppcms::json::value::value<char[10]>(&local_208,(char (*) [10])"127.0.0.1");
    std::__cxx11::string::string((string *)&oss,"forwarding",(allocator *)&local_1fc);
    psVar1 = (string *)cppcms::json::value::operator[]((string *)&settings);
    std::__cxx11::string::string(local_1e8,"rules",&local_20a);
    uVar3 = cppcms::json::value::operator[](psVar1);
    psVar1 = (string *)cppcms::json::value::operator[](uVar3);
    std::__cxx11::string::string((string *)local_1c8,"ip",&local_209);
    pcVar2 = (copyable *)cppcms::json::value::operator[](psVar1);
    cppcms::json::value::copyable::operator=(pcVar2,&local_208.d);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::string::~string((string *)&oss);
    cppcms::json::value::copyable::~copyable(&local_208.d);
    local_1fc = 0x1f91;
    cppcms::json::value::value<int>(&local_208,&local_1fc);
    std::__cxx11::string::string((string *)&oss,"forwarding",&local_20a);
    psVar1 = (string *)cppcms::json::value::operator[]((string *)&settings);
    std::__cxx11::string::string(local_1e8,"rules",&local_209);
    uVar3 = cppcms::json::value::operator[](psVar1);
    psVar1 = (string *)cppcms::json::value::operator[](uVar3);
    std::__cxx11::string::string((string *)local_1c8,"port",&local_1e9);
    pcVar2 = (copyable *)cppcms::json::value::operator[](psVar1);
    cppcms::json::value::copyable::operator=(pcVar2,&local_208.d);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::string::~string((string *)&oss);
    cppcms::json::value::copyable::~copyable(&local_208.d);
  }
  this_00 = (service *)operator_new(8);
  cppcms::service::service(this_00,&settings);
  std::__shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2>::reset<cppcms::service>
            ((__shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  if (internal) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Tesing internal forwarder");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar5 = (char *)cppcms::service::forwarder();
    cppcms::forwarder::check_forwading_rules_abi_cxx11_((char *)&oss,pcVar5,"127.0.0.1:8080");
    std::__cxx11::string::~string((string *)&oss);
    if (local_180 != 0x1f91) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar4 = std::operator<<((ostream *)&oss,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/forwarder_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x50);
      std::operator<<(poVar4,
                      " srv->forwarder().check_forwading_rules(\"127.0.0.1:8080\",\"/test\",\"\").second==8081"
                     );
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_01,local_1e8);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Tesing application level forwarding");
    std::endl<char,std::char_traits<char>>(poVar4);
    rhs = (application *)operator_new(0x28);
    mini_forwarder::mini_forwarder
              ((mini_forwarder *)rhs,
               (this->srv).super___shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    booster::intrusive_ptr<cppcms::application>::operator=(&this->app_,rhs);
    uVar6 = cppcms::service::applications_pool();
    booster::intrusive_ptr<cppcms::application>::intrusive_ptr(&local_1a8,&this->app_);
    cppcms::applications_pool::mount(uVar6,&local_1a8);
    booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&local_1a8);
  }
  cppcms::json::value::copyable::~copyable(&settings.d);
  return;
}

Assistant:

forwarder(bool internal)
	{
		cppcms::json::value settings;
		settings["service"]["api"]="http";
		settings["service"]["port"]=8080;
		settings["service"]["disable_global_exit_handling"]=true;
		settings["http"]["script_names"][0]="/test";
		if(internal) {
			settings["forwarding"]["rules"][0]["ip"]="127.0.0.1";
			settings["forwarding"]["rules"][0]["port"]=8081;
		}
		srv.reset(new cppcms::service(settings));

		if(!internal) {
			std::cout << "Tesing application level forwarding" << std::endl;
			app_=new mini_forwarder(*srv);
			srv->applications_pool().mount(app_);
		}
		else {
			std::cout << "Tesing internal forwarder" << std::endl;
			TEST(srv->forwarder().check_forwading_rules("127.0.0.1:8080","/test","").second==8081);
		}

	}